

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Recorder.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Recorder::ChFunction_Recorder
          (ChFunction_Recorder *this,ChFunction_Recorder *other)

{
  list<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_> *plVar1;
  
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Recorder_00b6d988;
  plVar1 = &this->m_points;
  (this->m_points).super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl
  ._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->m_points).super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->m_points).super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl
  ._M_node._M_size = 0;
  (this->m_last)._M_node = (_List_node_base *)0x0;
  if (this != other) {
    std::__cxx11::list<chrono::ChRecPoint,std::allocator<chrono::ChRecPoint>>::
    _M_assign_dispatch<std::_List_const_iterator<chrono::ChRecPoint>>
              ((list<chrono::ChRecPoint,std::allocator<chrono::ChRecPoint>> *)plVar1,
               (other->m_points).
               super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl.
               _M_node.super__List_node_base._M_next,&other->m_points);
  }
  (this->m_last)._M_node = (_List_node_base *)plVar1;
  return;
}

Assistant:

ChFunction_Recorder::ChFunction_Recorder(const ChFunction_Recorder& other) {
    m_points = other.m_points;
    m_last = m_points.end();
}